

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sastoken.c
# Opt level: O2

STRING_HANDLE construct_sas_token(char *key,char *scope,char *keyname,uint64_t expiry)

{
  int iVar1;
  HMACSHA256_RESULT HVar2;
  BUFFER_HANDLE handle;
  LOGGER_LOG p_Var3;
  BUFFER_HANDLE hash;
  STRING_HANDLE handle_00;
  STRING_HANDLE handle_01;
  size_t payloadLen;
  uchar *payload;
  size_t keyLen;
  uchar *key_00;
  STRING_HANDLE input;
  STRING_HANDLE s2;
  char tokenExpirationTime [32];
  
  tokenExpirationTime[0x10] = '\0';
  tokenExpirationTime[0x11] = '\0';
  tokenExpirationTime[0x12] = '\0';
  tokenExpirationTime[0x13] = '\0';
  tokenExpirationTime[0x14] = '\0';
  tokenExpirationTime[0x15] = '\0';
  tokenExpirationTime[0x16] = '\0';
  tokenExpirationTime[0x17] = '\0';
  tokenExpirationTime[0x18] = '\0';
  tokenExpirationTime[0x19] = '\0';
  tokenExpirationTime[0x1a] = '\0';
  tokenExpirationTime[0x1b] = '\0';
  tokenExpirationTime[0x1c] = '\0';
  tokenExpirationTime[0x1d] = '\0';
  tokenExpirationTime[0x1e] = '\0';
  tokenExpirationTime[0x1f] = '\0';
  tokenExpirationTime[0] = '\0';
  tokenExpirationTime[1] = '\0';
  tokenExpirationTime[2] = '\0';
  tokenExpirationTime[3] = '\0';
  tokenExpirationTime[4] = '\0';
  tokenExpirationTime[5] = '\0';
  tokenExpirationTime[6] = '\0';
  tokenExpirationTime[7] = '\0';
  tokenExpirationTime[8] = '\0';
  tokenExpirationTime[9] = '\0';
  tokenExpirationTime[10] = '\0';
  tokenExpirationTime[0xb] = '\0';
  tokenExpirationTime[0xc] = '\0';
  tokenExpirationTime[0xd] = '\0';
  tokenExpirationTime[0xe] = '\0';
  tokenExpirationTime[0xf] = '\0';
  handle = Azure_Base64_Decode(key);
  if (handle == (BUFFER_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/sastoken.c"
                ,"construct_sas_token",0xde,1,"Unable to decode the key for generating the SAS.");
      return (STRING_HANDLE)0x0;
    }
    return (STRING_HANDLE)0x0;
  }
  iVar1 = uint64_tToString(tokenExpirationTime,0x20,expiry);
  if (iVar1 != 0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      handle_01 = (STRING_HANDLE)0x0;
    }
    else {
      handle_01 = (STRING_HANDLE)0x0;
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/sastoken.c"
                ,"construct_sas_token",0xe6,1,
                "For some reason converting seconds to a string failed.  No SAS can be generated.");
    }
    goto LAB_00103f99;
  }
  hash = BUFFER_new();
  if ((hash == (BUFFER_HANDLE)0x0) || (handle_00 = STRING_new(), handle_00 == (STRING_HANDLE)0x0)) {
    handle_00 = (STRING_HANDLE)0x0;
LAB_00103f4a:
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
LAB_00103f86:
      handle_01 = (STRING_HANDLE)0x0;
    }
    else {
      handle_01 = (STRING_HANDLE)0x0;
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/sastoken.c"
                ,"construct_sas_token",0xf1,1,"Unable to allocate memory to prepare SAS token.");
    }
  }
  else {
    handle_01 = STRING_new();
    if (handle_01 == (STRING_HANDLE)0x0) goto LAB_00103f4a;
    iVar1 = STRING_concat(handle_00,scope);
    if (((iVar1 != 0) || (iVar1 = STRING_concat(handle_00,"\n"), iVar1 != 0)) ||
       (iVar1 = STRING_concat(handle_00,tokenExpirationTime), iVar1 != 0)) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/sastoken.c"
                  ,"construct_sas_token",0xfd,1,
                  "Unable to build the input to the HMAC to prepare SAS token.");
      }
      STRING_delete(handle_01);
      goto LAB_00103f86;
    }
    payloadLen = STRING_length(handle_00);
    payload = (uchar *)STRING_c_str(handle_00);
    keyLen = BUFFER_length(handle);
    key_00 = BUFFER_u_char(handle);
    HVar2 = HMACSHA256_ComputeHash(key_00,keyLen,payload,payloadLen,hash);
    if ((HVar2 == HMACSHA256_OK) && (input = Azure_Base64_Encode(hash), input != (STRING_HANDLE)0x0)
       ) {
      s2 = URL_Encode(input);
      if (s2 == (STRING_HANDLE)0x0) {
        s2 = (STRING_HANDLE)0x0;
        goto LAB_001040ac;
      }
      iVar1 = STRING_copy(handle_01,"SharedAccessSignature sr=");
      if ((((iVar1 != 0) || (iVar1 = STRING_concat(handle_01,scope), iVar1 != 0)) ||
          ((iVar1 = STRING_concat(handle_01,"&sig="), iVar1 != 0 ||
           (((iVar1 = STRING_concat_with_STRING(handle_01,s2), iVar1 != 0 ||
             (iVar1 = STRING_concat(handle_01,"&se="), iVar1 != 0)) ||
            (iVar1 = STRING_concat(handle_01,tokenExpirationTime), iVar1 != 0)))))) ||
         ((keyname != (char *)0x0 &&
          ((iVar1 = STRING_concat(handle_01,"&skn="), iVar1 != 0 ||
           (iVar1 = STRING_concat(handle_01,keyname), iVar1 != 0)))))) goto LAB_001040ac;
    }
    else {
      s2 = (STRING_HANDLE)0x0;
      input = (STRING_HANDLE)0x0;
LAB_001040ac:
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/sastoken.c"
                  ,"construct_sas_token",0x122,1,"Unable to build the SAS token.");
      }
      STRING_delete(handle_01);
      handle_01 = (STRING_HANDLE)0x0;
    }
    STRING_delete(input);
    STRING_delete(s2);
  }
  STRING_delete(handle_00);
  BUFFER_delete(hash);
LAB_00103f99:
  BUFFER_delete(handle);
  return handle_01;
}

Assistant:

static STRING_HANDLE construct_sas_token(const char* key, const char* scope, const char* keyname, uint64_t expiry)
{
    STRING_HANDLE result;

    char tokenExpirationTime[32] = { 0 };

    BUFFER_HANDLE decodedKey;

    /*Codes_SRS_SASTOKEN_06_029: [The key parameter is decoded from base64.]*/
    if ((decodedKey = Azure_Base64_Decode(key)) == NULL)
    {
        /*Codes_SRS_SASTOKEN_06_030: [If there is an error in the decoding then SASToken_Create shall return NULL.]*/
        LogError("Unable to decode the key for generating the SAS.");
        result = NULL;
    }
    else
    {
        /*Codes_SRS_SASTOKEN_06_026: [If the conversion to string form fails for any reason then SASToken_Create shall return NULL.]*/
        if (uint64_tToString(tokenExpirationTime, sizeof(tokenExpirationTime), expiry) != 0)
        {
            LogError("For some reason converting seconds to a string failed.  No SAS can be generated.");
            result = NULL;
        }
        else
        {
            STRING_HANDLE toBeHashed = NULL;
            BUFFER_HANDLE hash = NULL;
            if (((hash = BUFFER_new()) == NULL) ||
                ((toBeHashed = STRING_new()) == NULL) ||
                ((result = STRING_new()) == NULL))
            {
                LogError("Unable to allocate memory to prepare SAS token.");
                result = NULL;
            }
            else
            {
                /*Codes_SRS_SASTOKEN_06_009: [The scope is the basis for creating a STRING_HANDLE.]*/
                /*Codes_SRS_SASTOKEN_06_010: [A "\n" is appended to that string.]*/
                /*Codes_SRS_SASTOKEN_06_011: [tokenExpirationTime is appended to that string.]*/
                if ((STRING_concat(toBeHashed, scope) != 0) ||
                    (STRING_concat(toBeHashed, "\n") != 0) ||
                    (STRING_concat(toBeHashed, tokenExpirationTime) != 0))
                {
                    LogError("Unable to build the input to the HMAC to prepare SAS token.");
                    STRING_delete(result);
                    result = NULL;
                }
                else
                {
                    STRING_HANDLE base64Signature = NULL;
                    STRING_HANDLE urlEncodedSignature = NULL;
                    size_t inLen = STRING_length(toBeHashed);
                    const unsigned char* inBuf = (const unsigned char*)STRING_c_str(toBeHashed);
                    size_t outLen = BUFFER_length(decodedKey);
                    unsigned char* outBuf = BUFFER_u_char(decodedKey);
                    /*Codes_SRS_SASTOKEN_06_013: [If an error is returned from the HMAC256 function then NULL is returned from SASToken_Create.]*/
                    /*Codes_SRS_SASTOKEN_06_012: [An HMAC256 hash is calculated using the decodedKey, over toBeHashed.]*/
                    /*Codes_SRS_SASTOKEN_06_014: [If there are any errors from the following operations then NULL shall be returned.]*/
                    /*Codes_SRS_SASTOKEN_06_015: [The hash is base 64 encoded.]*/
                    /*Codes_SRS_SASTOKEN_06_028: [base64Signature shall be url encoded.]*/
                    /*Codes_SRS_SASTOKEN_06_016: [The string "SharedAccessSignature sr=" is the first part of the result of SASToken_Create.]*/
                    /*Codes_SRS_SASTOKEN_06_017: [The scope parameter is appended to result.]*/
                    /*Codes_SRS_SASTOKEN_06_018: [The string "&sig=" is appended to result.]*/
                    /*Codes_SRS_SASTOKEN_06_019: [The string urlEncodedSignature shall be appended to result.]*/
                    /*Codes_SRS_SASTOKEN_06_020: [The string "&se=" shall be appended to result.]*/
                    /*Codes_SRS_SASTOKEN_06_021: [tokenExpirationTime is appended to result.]*/
                    /*Codes_SRS_SASTOKEN_06_022: [If keyName is non-NULL, the string "&skn=" is appended to result.]*/
                    /*Codes_SRS_SASTOKEN_06_023: [If keyName is non-NULL, the argument keyName is appended to result.]*/
                    if ((HMACSHA256_ComputeHash(outBuf, outLen, inBuf, inLen, hash) != HMACSHA256_OK) ||
                        ((base64Signature = Azure_Base64_Encode(hash)) == NULL) ||
                        ((urlEncodedSignature = URL_Encode(base64Signature)) == NULL) ||
                        (STRING_copy(result, "SharedAccessSignature sr=") != 0) ||
                        (STRING_concat(result, scope) != 0) ||
                        (STRING_concat(result, "&sig=") != 0) ||
                        (STRING_concat_with_STRING(result, urlEncodedSignature) != 0) ||
                        (STRING_concat(result, "&se=") != 0) ||
                        (STRING_concat(result, tokenExpirationTime) != 0) ||
                        ((keyname != NULL) && (STRING_concat(result, "&skn=") != 0)) ||
                        ((keyname != NULL) && (STRING_concat(result, keyname) != 0)))
                    {
                        LogError("Unable to build the SAS token.");
                        STRING_delete(result);
                        result = NULL;
                    }
                    else
                    {
                        /* everything OK */
                    }
                    STRING_delete(base64Signature);
                    STRING_delete(urlEncodedSignature);
                }
            }
            STRING_delete(toBeHashed);
            BUFFER_delete(hash);
        }
        BUFFER_delete(decodedKey);
    }
    return result;
}